

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alprd_analyze.hpp
# Opt level: O2

unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>,_true>
duckdb::AlpRDInitAnalyze<float>(ColumnData *col_data,PhysicalType type)

{
  undefined7 in_register_00000031;
  CompressionInfo info;
  _func_int **local_20;
  CompressionInfo local_18;
  
  local_18.block_manager = *(BlockManager **)(CONCAT71(in_register_00000031,type) + 0x18);
  make_uniq<duckdb::AlpRDAnalyzeState<float>,duckdb::CompressionInfo&>
            ((duckdb *)&local_20,&local_18);
  col_data->_vptr_ColumnData = local_20;
  return (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)
         (unique_ptr<duckdb::AnalyzeState,_std::default_delete<duckdb::AnalyzeState>_>)col_data;
}

Assistant:

unique_ptr<AnalyzeState> AlpRDInitAnalyze(ColumnData &col_data, PhysicalType type) {
	CompressionInfo info(col_data.GetBlockManager());
	return make_uniq<AlpRDAnalyzeState<T>>(info);
}